

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O2

bool callOnceGetSum(void)

{
  int iVar1;
  bool bVar2;
  allocator<char> local_59;
  string local_58;
  Test t;
  
  Test::Test(&t);
  iVar1 = accessor::callFunction<accessor::FunctionWrapper<Test,int,int,int>,Test,int,int>(&t,1,1);
  if (iVar1 == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"getSum",&local_59);
    iVar1 = Test::getMethodVisitedCounter(&t,&local_58);
    bVar2 = 0 < iVar1;
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    bVar2 = false;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&t);
  return bVar2;
}

Assistant:

bool callOnceGetSum()
{
  Test t;

  return (::accessor::callFunction<TestGetSum>(t, 1, 1) == 2) &&
         (t.getMethodVisitedCounter("getSum") > 0);
}